

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

int IoTHubClientCore_LL_DeviceMethodComplete
              (char *method_name,uchar *payLoad,size_t size,METHOD_HANDLE response_id,void *ctx)

{
  undefined4 uVar1;
  int iVar2;
  IOTHUB_CLIENT_RESULT IVar3;
  LOGGER_LOG p_Var4;
  char *__ptr;
  char *component_name;
  char *command_name;
  size_t response_size;
  uchar *payload_resp;
  char *local_88;
  char *local_80;
  long local_78;
  void *pvStack_70;
  long local_68;
  ulong uStack_60;
  char *local_58;
  char *local_50;
  char *local_48;
  uchar *local_40;
  size_t local_38;
  
  if (ctx == (void *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x351;
    }
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
              ,"IoTHubClientCore_LL_DeviceMethodComplete",0x350,1,"Invalid argument ctx=%p",0);
    return 0x351;
  }
  iVar2 = *(int *)((long)ctx + 0x120);
  if (iVar2 == 6) {
    local_80 = (char *)0x0;
    local_88 = (char *)0x0;
    IVar3 = IoTHubClientCore_LL_ParseMethodToCommand(method_name,&local_88,&local_80);
    if (IVar3 == IOTHUB_CLIENT_OK) {
      local_58 = (char *)CONCAT44(local_58._4_4_,1);
      local_50 = local_88;
      local_48 = local_80;
      pvStack_70 = (void *)0x0;
      local_68 = 0;
      local_78 = 1;
      uStack_60 = 500;
      local_40 = payLoad;
      local_38 = size;
      (**(code **)((long)ctx + 0x138))(&local_58,&local_78,*(undefined8 *)((long)ctx + 0x140));
      iVar2 = 0x341;
      if (local_68 != 0 && pvStack_70 != (void *)0x0) {
        iVar2 = (**(code **)((long)ctx + 0x60))
                          (*(undefined8 *)((long)ctx + 0x40),response_id,pvStack_70,local_68,
                           uStack_60 & 0xffffffff);
      }
      free(pvStack_70);
      __ptr = local_88;
    }
    else {
      p_Var4 = xlogging_get_log_function();
      iVar2 = 0x326;
      __ptr = local_88;
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"invoke_command_callback",0x325,1,"Cannot parse command/component name");
        __ptr = local_88;
      }
    }
  }
  else {
    if (iVar2 == 5) {
      iVar2 = (**(code **)((long)ctx + 0x130))
                        (method_name,payLoad,size,response_id,*(undefined8 *)((long)ctx + 0x140));
      return iVar2;
    }
    if (iVar2 != 4) {
      return 0;
    }
    local_58 = (char *)0x0;
    local_78 = 0;
    uVar1 = (**(code **)((long)ctx + 0x128))
                      (method_name,payLoad,size,&local_58,&local_78,
                       *(undefined8 *)((long)ctx + 0x140));
    iVar2 = 0x364;
    if (local_78 != 0 && local_58 != (char *)0x0) {
      iVar2 = (**(code **)((long)ctx + 0x60))
                        (*(undefined8 *)((long)ctx + 0x40),response_id,local_58,local_78,uVar1);
    }
    __ptr = local_58;
    if (local_58 == (char *)0x0) {
      return iVar2;
    }
  }
  free(__ptr);
  return iVar2;
}

Assistant:

static int IoTHubClientCore_LL_DeviceMethodComplete(const char* method_name, const unsigned char* payLoad, size_t size, METHOD_HANDLE response_id, void* ctx)
{
    int result;
    if (ctx == NULL)
    {
        LogError("Invalid argument ctx=%p", ctx);
        result = MU_FAILURE;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)ctx;
        switch (handleData->methodCallback.type)
        {
            case CALLBACK_TYPE_METHOD:
            {
                unsigned char* payload_resp = NULL;
                size_t response_size = 0;
                result = handleData->methodCallback.deviceMethodCallback(method_name, payLoad, size, &payload_resp, &response_size, handleData->methodCallback.userContextCallback);

                if (payload_resp != NULL && response_size > 0)
                {
                    result = handleData->IoTHubTransport_DeviceMethod_Response(handleData->deviceHandle, response_id, payload_resp, response_size, result);
                }
                else
                {
                    result = MU_FAILURE;
                }
                if (payload_resp != NULL)
                {
                    free(payload_resp);
                }
                break;
            }
            case CALLBACK_TYPE_COMMAND:
                result = invoke_command_callback(handleData, method_name, payLoad, size, response_id);
                break;
            case CALLBACK_TYPE_INBOUND_METHOD:
                result = handleData->methodCallback.inboundDeviceMethodCallback(method_name, payLoad, size, response_id, handleData->methodCallback.userContextCallback);
                break;
            default:
                result = 0;
                break;
        }
    }
    return result;
}